

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# async-unix.c++
# Opt level: O2

void kj::UnixEventPort::signalHandler(int param_1,siginfo_t *siginfo,void *param_3)

{
  long in_FS_OFFSET;
  
  if (*(UnixEventPort **)(in_FS_OFFSET + -0x20) != (UnixEventPort *)0x0) {
    gotSignal(*(UnixEventPort **)(in_FS_OFFSET + -0x20),siginfo);
  }
  return;
}

Assistant:

void UnixEventPort::signalHandler(int, siginfo_t* siginfo, void*) noexcept {
  // Since this signal handler is *only* called during `epoll_pwait()`, we aren't subject to the
  // usual signal-safety concerns. We can treat this more like a callback. So, we can just call
  // gotSignal() directly, no biggy.

  // Note that, if somehow the signal handler is invoked when *not* running `epoll_pwait()`, then
  // `threadEventPort` will be null. We silently ignore the signal in this case. This should never
  // happen in normal execution, so you might argue we should assert-fail instead. However:
  // - We obviously can't throw from here, so we'd have to crash instead.
  // - The Cloudflare Workers runtime relies on this no-op behavior for a certain hack. The hack
  //   in question involves unblocking a signal from the signal mask and relying on it to interrupt
  //   certain blocking syscalls, causing them to fail with EINTR. The hack does not need the
  //   handler to do anything except return in this case. The hacky code makes sure to restore the
  //   signal mask before returning to the event loop.

  UnixEventPort* current = threadEventPort;
  if (current != nullptr) {
    current->gotSignal(*siginfo);
  }
}